

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O3

int loadSettings(Settings *s,json *inj,string *fjson)

{
  size_t sVar1;
  pointer pcVar2;
  string str;
  string str_00;
  bool bVar3;
  int iVar4;
  key_type *pkVar5;
  reference pbVar6;
  time_t tVar7;
  ostream *poVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  long lVar10;
  char *pcVar11;
  string *this;
  _Alloc_hider _Var12;
  char *__end;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  _Put_time<char> __f;
  _Put_time<char> __f_00;
  iterator result_1;
  string cmapName;
  string beforeId;
  string afterId;
  string typeId;
  string kernelId;
  string imapId;
  string allCmapsId;
  string cmapNameId;
  string fgpxId;
  string fnameId;
  string fitnxId;
  string fityId;
  string fitxId;
  string sampleId;
  string verbId;
  string mapTypeId;
  string gaussianAmpId;
  string invertMapId;
  string cmapFileId;
  string fitnyId;
  string marginId;
  string maxyId;
  string maxxId;
  string minxId;
  string radiusId;
  string sizeyId;
  string sizexId;
  string minyId;
  iterator it;
  undefined8 in_stack_fffffffffffffae8;
  Settings *pSVar14;
  Settings *s_00;
  string sVar15;
  int in_stack_fffffffffffffaf8;
  Sampling SVar16;
  int iVar17;
  int in_stack_fffffffffffffafc;
  size_type sVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4f8;
  int local_4e8;
  undefined4 uStack_4e4;
  long lStack_4e0;
  char *local_4d8;
  json *local_4d0;
  undefined4 local_4c8;
  uint local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  tm *local_4b8;
  tm *local_4b0;
  long *local_4a8;
  long local_4a0;
  long local_498 [2];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_488;
  long *local_478;
  size_t local_470;
  long local_468 [2];
  long *local_458;
  size_t local_450;
  long local_448 [2];
  long *local_438;
  size_t local_430;
  long local_428 [2];
  long *local_418;
  size_t local_410;
  long local_408 [2];
  long *local_3f8;
  size_t local_3f0;
  long local_3e8 [2];
  long *local_3d8;
  size_t local_3d0;
  long local_3c8 [2];
  long *local_3b8;
  size_t local_3b0;
  long local_3a8 [2];
  long *local_398;
  size_t local_390;
  long local_388 [2];
  long *local_378;
  size_t local_370;
  long local_368 [2];
  long *local_358;
  size_t local_350;
  long local_348 [2];
  long *local_338;
  size_t local_330;
  long local_328 [2];
  long *local_318;
  size_t local_310;
  long local_308 [2];
  long *local_2f8;
  size_t local_2f0;
  long local_2e8 [2];
  long *local_2d8;
  size_t local_2d0;
  long local_2c8 [2];
  string *local_2b8;
  long *local_2b0;
  size_t local_2a8;
  long local_2a0 [2];
  long *local_290;
  size_t local_288;
  long local_280 [2];
  long *local_270;
  size_t local_268;
  long local_260 [2];
  long *local_250;
  size_t local_248;
  long local_240 [2];
  long *local_230;
  size_t local_228;
  long local_220 [2];
  long *local_210;
  size_t local_208;
  long local_200 [2];
  long *local_1f0;
  size_t local_1e8;
  long local_1e0 [2];
  long *local_1d0;
  size_t local_1c8;
  long local_1c0 [2];
  long *local_1b0;
  size_t local_1a8;
  long local_1a0 [2];
  long *local_190;
  size_t local_188;
  long local_180 [2];
  long *local_170;
  size_t local_168;
  long local_160 [2];
  long *local_150;
  size_t local_148;
  long local_140 [2];
  long *local_130;
  size_t local_128;
  long local_120 [2];
  time_t *local_110;
  string *local_108;
  string *local_100;
  double *local_f8;
  string local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  string local_70;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  s->nx = 0x500;
  s->ny = 0x2d0;
  s->verb = 0;
  s->sampling = autosample;
  s->r = 10;
  s->margin = 0.0;
  s->fitx = false;
  s->fity = false;
  s->fitnx = false;
  s->fitny = false;
  s->minx = 0.0;
  s->maxx = 0.0;
  s->miny = 0.0;
  s->maxy = 0.0;
  std::__cxx11::string::find_last_of((char *)fjson,0x143a55,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&stack0xfffffffffffffaf8,(ulong)fjson);
  local_100 = (string *)&s->fname;
  std::__cxx11::string::operator=(local_100,(string *)&stack0xfffffffffffffaf8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8) != &aStack_4f8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                    aStack_4f8._M_allocated_capacity + 1);
  }
  local_108 = (string *)&s->fgpx;
  pSVar14 = s;
  std::__cxx11::string::_M_replace((ulong)local_108,0,(char *)(s->fgpx)._M_string_length,0x143bc1);
  local_2b8 = (string *)&s->cmapFile;
  std::__cxx11::string::_M_replace
            ((ulong)local_2b8,0,(char *)(s->cmapFile)._M_string_length,0x143ad1);
  local_4a8 = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"","");
  s->allCmaps = false;
  s->gka = 10.0;
  s->kernel = cone;
  s->filterType = false;
  s->filterAfter = false;
  s->filterBefore = false;
  s->after = 0;
  s->before = 0;
  s->mapType = heat;
  local_150 = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Image size x","");
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Image size y","");
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Verbosity","");
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Sampling","");
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"Kernel radius","");
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Min x","");
  local_130 = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Min y","");
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Max x","");
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Max y","");
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Margin","");
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Fit x","");
  local_338 = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Fit y","");
  local_358 = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Fit nx","");
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Fit ny","");
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"File name prefix","");
  local_398 = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"GPX files","");
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Colormap file","");
  local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"Colormap name","");
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"All colormaps","");
  local_3f8 = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"Color map","");
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Invert color map","");
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Gaussian amplitude","");
  local_418 = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Kernel","");
  local_438 = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Type","");
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"After","");
  local_478 = local_468;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"Before","");
  local_2b0 = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Map type","");
  local_f8 = &pSVar14->minx;
  local_110 = &pSVar14->after;
  local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_50.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
  s_00 = pSVar14;
  local_50.m_object = inj;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_begin(&local_50);
  local_4b8 = &pSVar14->beforetm;
  local_4b0 = &pSVar14->aftertm;
  local_4c0 = 0;
  local_4c4 = 0;
  local_4c8 = 0;
  local_4bc = 0;
  local_4d0 = inj;
  while( true ) {
    SVar16 = (Sampling)inj;
    iVar17 = (int)((ulong)inj >> 0x20);
    sVar18 = 0;
    aStack_4f8._M_allocated_capacity = 0;
    aStack_4f8._8_8_ = 0x8000000000000000;
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_end((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&stack0xfffffffffffffaf8);
    bVar3 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_50,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&stack0xfffffffffffffaf8);
    if (bVar3) break;
    pkVar5 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key(&local_50);
    sVar1 = pkVar5->_M_string_length;
    if ((sVar1 == local_148) &&
       (((sVar1 == 0 || (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_150,sVar1), iVar4 == 0)) &&
        (pbVar6 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*(&local_50), (byte)(pbVar6->m_type - number_integer) < 3)))) {
      pbVar6 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_50);
      iVar17 = 0;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                (pbVar6,(int *)&stack0xfffffffffffffaf8);
      s_00->nx = iVar17;
    }
    else {
      pkVar5 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::key(&local_50);
      sVar1 = pkVar5->_M_string_length;
      if (((sVar1 == local_168) &&
          ((sVar1 == 0 || (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_170,sVar1), iVar4 == 0))))
         && (pbVar6 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*(&local_50), (byte)(pbVar6->m_type - number_integer) < 3)) {
        pbVar6 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&local_50);
        iVar17 = 0;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                  (pbVar6,(int *)&stack0xfffffffffffffaf8);
        s_00->ny = iVar17;
      }
      else {
        pkVar5 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::key(&local_50);
        sVar1 = pkVar5->_M_string_length;
        if (((sVar1 == local_2d0) &&
            ((sVar1 == 0 || (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_2d8,sVar1), iVar4 == 0)))
            ) && (pbVar6 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*(&local_50), (byte)(pbVar6->m_type - number_integer) < 3)) {
          pbVar6 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_50);
          iVar17 = 0;
          nlohmann::detail::
          from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                    (pbVar6,(int *)&stack0xfffffffffffffaf8);
          s_00->verb = iVar17;
        }
        else {
          pkVar5 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::key(&local_50);
          sVar1 = pkVar5->_M_string_length;
          if (((sVar1 == local_2f0) &&
              ((sVar1 == 0 || (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_2f8,sVar1), iVar4 == 0)
               ))) && ((pbVar6 = nlohmann::detail::
                                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ::operator*(&local_50), (byte)(pbVar6->m_type - number_integer) < 3
                       || (pbVar6 = nlohmann::detail::
                                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    ::operator*(&local_50), pbVar6->m_type == string)))) {
            pbVar6 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_50);
            if ((byte)(pbVar6->m_type - number_integer) < 3) {
              pbVar6 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&local_50);
              nlohmann::detail::
              get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_int,_0>
                        (pbVar6,(uint *)&stack0xfffffffffffffaf8);
              s_00->sampling = SVar16;
            }
            else {
              pbVar6 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&local_50);
              aStack_4f8._M_allocated_capacity = 0x736977746e696f70;
              aStack_4f8._8_2_ = 0x65;
              local_488.m_type = null;
              local_488.m_value.object = (object_t *)0x0;
              _Var12._M_p = (pointer)&aStack_4f8;
              nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
              construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (&local_488,(string_t *)&stack0xfffffffffffffaf8);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::assert_invariant(&local_488,true);
              bVar3 = nlohmann::operator==(pbVar6,&local_488);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::~basic_json(&local_488);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var12._M_p != &aStack_4f8) {
                operator_delete(_Var12._M_p,aStack_4f8._M_allocated_capacity + 1);
              }
              if (bVar3) {
                s_00->sampling = pointwise;
                inj = local_4d0;
              }
              else {
                pbVar6 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&local_50);
                aStack_4f8._M_allocated_capacity._0_7_ = 0x7261656e696c;
                local_488.m_type = null;
                local_488.m_value.object = (object_t *)0x0;
                _Var12._M_p = (pointer)&aStack_4f8;
                nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
                construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (&local_488,(string_t *)&stack0xfffffffffffffaf8);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::assert_invariant(&local_488,true);
                bVar3 = nlohmann::operator==(pbVar6,&local_488);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::~basic_json(&local_488);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var12._M_p != &aStack_4f8) {
                  operator_delete(_Var12._M_p,aStack_4f8._M_allocated_capacity + 1);
                }
                if (bVar3) {
                  s_00->sampling = linear;
                  inj = local_4d0;
                }
                else {
                  pbVar6 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*(&local_50);
                  aStack_4f8._M_allocated_capacity = 0x706d61736f747561;
                  aStack_4f8._8_3_ = 0x656c;
                  local_488.m_type = null;
                  local_488.m_value.object = (object_t *)0x0;
                  _Var12._M_p = (pointer)&aStack_4f8;
                  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
                  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                            (&local_488,(string_t *)&stack0xfffffffffffffaf8);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::assert_invariant(&local_488,true);
                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::~basic_json(&local_488);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var12._M_p != &aStack_4f8) {
                    operator_delete(_Var12._M_p,aStack_4f8._M_allocated_capacity + 1);
                  }
                  inj = local_4d0;
                  if (bVar3) {
                    s_00->sampling = autosample;
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"\nWarning:  unknown sampling value ",0x22);
                    pbVar6 = nlohmann::detail::
                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*(&local_50);
                    poVar8 = nlohmann::operator<<((ostream *)&std::cout,pbVar6);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar8,", defaulting to \"",0x11);
                    _Var12._M_p = (pointer)&aStack_4f8;
                    aStack_4f8._M_allocated_capacity = 0x706d61736f747561;
                    aStack_4f8._8_3_ = 0x656c;
                    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar8,_Var12._M_p,10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
LAB_0010aada:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var12._M_p != &aStack_4f8) {
LAB_0010a223:
                      operator_delete(_Var12._M_p,aStack_4f8._M_allocated_capacity + 1);
                    }
                  }
                }
              }
            }
          }
          else {
            pkVar5 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::key(&local_50);
            sVar1 = pkVar5->_M_string_length;
            if ((sVar1 == local_188) &&
               (((sVar1 == 0 ||
                 (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_190,sVar1), iVar4 == 0)) &&
                (pbVar6 = nlohmann::detail::
                          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ::operator*(&local_50), (byte)(pbVar6->m_type - number_integer) < 3)))) {
              pbVar6 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator*(&local_50);
              iVar17 = 0;
              nlohmann::detail::
              from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                        (pbVar6,(int *)&stack0xfffffffffffffaf8);
              s_00->r = iVar17;
            }
            else {
              pkVar5 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::key(&local_50);
              sVar1 = pkVar5->_M_string_length;
              if (((sVar1 == local_1a8) &&
                  ((sVar1 == 0 ||
                   (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_1b0,sVar1), iVar4 == 0)))) &&
                 (pbVar6 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*(&local_50), (byte)(pbVar6->m_type - number_integer) < 3)) {
                pbVar6 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&local_50);
                iVar17 = 0;
                iVar4 = 0;
                nlohmann::detail::
                get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                          (pbVar6,(double *)&stack0xfffffffffffffaf8);
                *local_f8 = (double)CONCAT44(iVar4,iVar17);
                local_4bc = (undefined4)CONCAT71((int7)((ulong)local_f8 >> 8),1);
              }
              else {
                pkVar5 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::key(&local_50);
                sVar1 = pkVar5->_M_string_length;
                if (((sVar1 == local_128) &&
                    ((sVar1 == 0 ||
                     (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_130,sVar1), iVar4 == 0)))) &&
                   (pbVar6 = nlohmann::detail::
                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*(&local_50), (byte)(pbVar6->m_type - number_integer) < 3)) {
                  pbVar6 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*(&local_50);
                  iVar17 = 0;
                  iVar4 = 0;
                  nlohmann::detail::
                  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                            (pbVar6,(double *)&stack0xfffffffffffffaf8);
                  s_00->miny = (double)CONCAT44(iVar4,iVar17);
                  local_4c0 = (undefined4)CONCAT71((int7)((ulong)s_00 >> 8),1);
                }
                else {
                  pkVar5 = nlohmann::detail::
                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::key(&local_50);
                  sVar1 = pkVar5->_M_string_length;
                  if ((sVar1 == local_1c8) &&
                     (((sVar1 == 0 ||
                       (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_1d0,sVar1), iVar4 == 0)) &&
                      (pbVar6 = nlohmann::detail::
                                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ::operator*(&local_50), (byte)(pbVar6->m_type - number_integer) < 3)
                      ))) {
                    pbVar6 = nlohmann::detail::
                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*(&local_50);
                    iVar17 = 0;
                    iVar4 = 0;
                    nlohmann::detail::
                    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                              (pbVar6,(double *)&stack0xfffffffffffffaf8);
                    s_00->maxx = (double)CONCAT44(iVar4,iVar17);
                    local_4c4 = (uint)CONCAT71((int7)((ulong)s_00 >> 8),1);
                  }
                  else {
                    pkVar5 = nlohmann::detail::
                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::key(&local_50);
                    sVar1 = pkVar5->_M_string_length;
                    if (((sVar1 == local_1e8) &&
                        ((sVar1 == 0 ||
                         (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_1f0,sVar1), iVar4 == 0))))
                       && (pbVar6 = nlohmann::detail::
                                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    ::operator*(&local_50),
                          (byte)(pbVar6->m_type - number_integer) < 3)) {
                      pbVar6 = nlohmann::detail::
                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::operator*(&local_50);
                      iVar17 = 0;
                      iVar4 = 0;
                      nlohmann::detail::
                      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                                (pbVar6,(double *)&stack0xfffffffffffffaf8);
                      s_00->maxy = (double)CONCAT44(iVar4,iVar17);
                      local_4c8 = (undefined4)CONCAT71((int7)((ulong)s_00 >> 8),1);
                    }
                    else {
                      pkVar5 = nlohmann::detail::
                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               ::key(&local_50);
                      sVar1 = pkVar5->_M_string_length;
                      if (((sVar1 == local_208) &&
                          ((sVar1 == 0 ||
                           (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_210,sVar1), iVar4 == 0))))
                         && (pbVar6 = nlohmann::detail::
                                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      ::operator*(&local_50),
                            (byte)(pbVar6->m_type - number_integer) < 3)) {
                        pbVar6 = nlohmann::detail::
                                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ::operator*(&local_50);
                        iVar17 = 0;
                        iVar4 = 0;
                        nlohmann::detail::
                        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                                  (pbVar6,(double *)&stack0xfffffffffffffaf8);
                        s_00->margin = (double)CONCAT44(iVar4,iVar17);
                      }
                      else {
                        pkVar5 = nlohmann::detail::
                                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ::key(&local_50);
                        sVar1 = pkVar5->_M_string_length;
                        if ((sVar1 == local_310) &&
                           (((sVar1 == 0 ||
                             (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_318,sVar1), iVar4 == 0))
                            && (pbVar6 = nlohmann::detail::
                                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         ::operator*(&local_50), pbVar6->m_type == boolean)))) {
                          pbVar6 = nlohmann::detail::
                                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ::operator*(&local_50);
                          sVar15 = (string)0x0;
                          nlohmann::detail::
                          from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                    (pbVar6,(boolean_t *)&stack0xfffffffffffffaf8);
                          s_00->fitx = (bool)sVar15;
                        }
                        else {
                          pkVar5 = nlohmann::detail::
                                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   ::key(&local_50);
                          sVar1 = pkVar5->_M_string_length;
                          if (((sVar1 == local_330) &&
                              ((sVar1 == 0 ||
                               (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_338,sVar1), iVar4 == 0
                               )))) && (pbVar6 = nlohmann::detail::
                                                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                 ::operator*(&local_50), pbVar6->m_type == boolean))
                          {
                            pbVar6 = nlohmann::detail::
                                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ::operator*(&local_50);
                            sVar15 = (string)0x0;
                            nlohmann::detail::
                            from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                      (pbVar6,(boolean_t *)&stack0xfffffffffffffaf8);
                            s_00->fity = (bool)sVar15;
                          }
                          else {
                            pkVar5 = nlohmann::detail::
                                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ::key(&local_50);
                            sVar1 = pkVar5->_M_string_length;
                            if (((sVar1 == local_350) &&
                                ((sVar1 == 0 ||
                                 (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_358,sVar1),
                                 iVar4 == 0)))) &&
                               (pbVar6 = nlohmann::detail::
                                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         ::operator*(&local_50), pbVar6->m_type == boolean)) {
                              pbVar6 = nlohmann::detail::
                                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       ::operator*(&local_50);
                              sVar15 = (string)0x0;
                              nlohmann::detail::
                              from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                        (pbVar6,(boolean_t *)&stack0xfffffffffffffaf8);
                              s_00->fitnx = (bool)sVar15;
                            }
                            else {
                              pkVar5 = nlohmann::detail::
                                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       ::key(&local_50);
                              sVar1 = pkVar5->_M_string_length;
                              if ((sVar1 == local_228) &&
                                 (((sVar1 == 0 ||
                                   (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_230,sVar1),
                                   iVar4 == 0)) &&
                                  (pbVar6 = nlohmann::detail::
                                            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ::operator*(&local_50), pbVar6->m_type == boolean)))) {
                                pbVar6 = nlohmann::detail::
                                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         ::operator*(&local_50);
                                sVar15 = (string)0x0;
                                nlohmann::detail::
                                from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                          (pbVar6,(boolean_t *)&stack0xfffffffffffffaf8);
                                s_00->fitny = (bool)sVar15;
                              }
                              else {
                                pkVar5 = nlohmann::detail::
                                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                         ::key(&local_50);
                                sVar1 = pkVar5->_M_string_length;
                                if (((sVar1 == local_370) &&
                                    ((sVar1 == 0 ||
                                     (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_378,sVar1),
                                     iVar4 == 0)))) &&
                                   (pbVar6 = nlohmann::detail::
                                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                             ::operator*(&local_50), pbVar6->m_type == string)) {
                                  pbVar6 = nlohmann::detail::
                                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                           ::operator*(&local_50);
                                  nlohmann::
                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  ::
                                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                            ((tm *)&stack0xfffffffffffffaf8,pbVar6);
                                  this = local_100;
                                }
                                else {
                                  pkVar5 = nlohmann::detail::
                                           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                           ::key(&local_50);
                                  sVar1 = pkVar5->_M_string_length;
                                  if (((sVar1 == local_390) &&
                                      ((sVar1 == 0 ||
                                       (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_398,sVar1),
                                       iVar4 == 0)))) &&
                                     (pbVar6 = nlohmann::detail::
                                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               ::operator*(&local_50), pbVar6->m_type == string)) {
                                    pbVar6 = nlohmann::detail::
                                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                             ::operator*(&local_50);
                                    nlohmann::
                                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    ::
                                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                              ((tm *)&stack0xfffffffffffffaf8,pbVar6);
                                    this = local_108;
                                  }
                                  else {
                                    pkVar5 = nlohmann::detail::
                                             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                             ::key(&local_50);
                                    sVar1 = pkVar5->_M_string_length;
                                    if ((sVar1 == local_248) &&
                                       (((sVar1 == 0 ||
                                         (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_250,sVar1),
                                         iVar4 == 0)) &&
                                        (pbVar6 = nlohmann::detail::
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar6->m_type == string))
                                       )) {
                                      pbVar6 = nlohmann::detail::
                                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               ::operator*(&local_50);
                                      nlohmann::
                                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      ::
                                      get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                ((tm *)&stack0xfffffffffffffaf8,pbVar6);
                                      this = local_2b8;
                                    }
                                    else {
                                      pkVar5 = nlohmann::detail::
                                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               ::key(&local_50);
                                      sVar1 = pkVar5->_M_string_length;
                                      if (((sVar1 != local_3b0) ||
                                          ((sVar1 != 0 &&
                                           (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_3b8,sVar1)
                                           , iVar4 != 0)))) ||
                                         (pbVar6 = nlohmann::detail::
                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar6->m_type != string))
                                      {
                                        pkVar5 = nlohmann::detail::
                                                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                 ::key(&local_50);
                                        sVar1 = pkVar5->_M_string_length;
                                        if (((sVar1 == local_3f0) &&
                                            ((sVar1 == 0 ||
                                             (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_3f8,
                                                           sVar1), iVar4 == 0)))) &&
                                           (pbVar6 = nlohmann::detail::
                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50),
                                           (byte)(pbVar6->m_type - number_integer) < 3)) {
                                          pbVar6 = nlohmann::detail::
                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                          iVar17 = 0;
                                          nlohmann::detail::
                                          from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                                                    (pbVar6,(int *)&stack0xfffffffffffffaf8);
                                          (s_00->c).imap = iVar17;
                                        }
                                        else {
                                          pkVar5 = nlohmann::detail::
                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                          sVar1 = pkVar5->_M_string_length;
                                          if ((sVar1 == local_268) &&
                                             (((sVar1 == 0 ||
                                               (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_270,
                                                             sVar1), iVar4 == 0)) &&
                                              (pbVar6 = nlohmann::detail::
                                                                                                                
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar6->m_type == boolean)
                                              ))) {
                                            pbVar6 = nlohmann::detail::
                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                            sVar15 = (string)0x0;
                                            nlohmann::detail::
                                            from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                                      (pbVar6,(boolean_t *)&stack0xfffffffffffffaf8)
                                            ;
                                            (s_00->c).inv = (bool)sVar15;
                                          }
                                          else {
                                            pkVar5 = nlohmann::detail::
                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                            sVar1 = pkVar5->_M_string_length;
                                            if (((sVar1 == local_3d0) &&
                                                ((sVar1 == 0 ||
                                                 (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,local_3d8,
                                                               sVar1), iVar4 == 0)))) &&
                                               (pbVar6 = nlohmann::detail::
                                                                                                                  
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar6->m_type == boolean)
                                               ) {
                                              pbVar6 = nlohmann::detail::
                                                                                                              
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                              sVar15 = (string)0x0;
                                              nlohmann::detail::
                                              from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                                        (pbVar6,(boolean_t *)
                                                                &stack0xfffffffffffffaf8);
                                              s_00->allCmaps = (bool)sVar15;
                                            }
                                            else {
                                              pkVar5 = nlohmann::detail::
                                                                                                              
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                              sVar1 = pkVar5->_M_string_length;
                                              if (((sVar1 == local_288) &&
                                                  ((sVar1 == 0 ||
                                                   (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,
                                                                 local_290,sVar1), iVar4 == 0)))) &&
                                                 (pbVar6 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50),
                                                 (byte)(pbVar6->m_type - number_integer) < 3)) {
                                                pbVar6 = nlohmann::detail::
                                                                                                                  
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                iVar17 = 0;
                                                iVar4 = 0;
                                                nlohmann::detail::
                                                get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                                                          (pbVar6,(double *)&stack0xfffffffffffffaf8
                                                          );
                                                s_00->gka = (double)CONCAT44(iVar4,iVar17);
                                              }
                                              else {
                                                pkVar5 = nlohmann::detail::
                                                                                                                  
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                                sVar1 = pkVar5->_M_string_length;
                                                if ((sVar1 == local_410) &&
                                                   (((sVar1 == 0 ||
                                                     (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,
                                                                   local_418,sVar1), iVar4 == 0)) &&
                                                    (pbVar6 = nlohmann::detail::
                                                                                                                            
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar6->m_type == string))
                                                  )) {
                                                  pbVar6 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity =
                                                       0x64696d61727970;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar3) {
                                                    s_00->kernel = pyramid;
                                                    inj = local_4d0;
                                                  }
                                                  else {
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity =
                                                       0x7265646e696c7963;
                                                  aStack_4f8._8_8_ =
                                                       aStack_4f8._8_8_ & 0xffffffffffffff00;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar3) {
                                                    s_00->kernel = cylinder;
                                                    inj = local_4d0;
                                                  }
                                                  else {
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity =
                                                       0x6e61697373756167;
                                                  aStack_4f8._8_8_ =
                                                       aStack_4f8._8_8_ & 0xffffffffffffff00;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar3) {
                                                    s_00->kernel = gaussian;
                                                    inj = local_4d0;
                                                  }
                                                  else {
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity._0_5_ =
                                                       0x656e6f63;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  inj = local_4d0;
                                                  if (!bVar3) {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "\nWarning:  unknown kernel value ",
                                                             0x20);
                                                  pbVar6 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  poVar8 = nlohmann::operator<<
                                                                     ((ostream *)&std::cout,pbVar6);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar8,", defaulting to \"",0x11);
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  aStack_4f8._M_allocated_capacity._0_5_ =
                                                       0x656e6f63;
                                                  poVar8 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            (poVar8,_Var12._M_p,4);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar8,"\"\n",2);
                                                  goto LAB_0010aada;
                                                  }
                                                  s_00->kernel = cone;
                                                  }
                                                  }
                                                  }
                                                }
                                                else {
                                                  pkVar5 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                                  sVar1 = pkVar5->_M_string_length;
                                                  if (((sVar1 == local_430) &&
                                                      ((sVar1 == 0 ||
                                                       (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,
                                                                     local_438,sVar1), iVar4 == 0)))
                                                      ) && (pbVar6 = nlohmann::detail::
                                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar6->m_type == string))
                                                  {
                                                    s_00->filterType = true;
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity._0_5_ =
                                                       0x656b6948;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar3) {
                                                    s_00->type = hike;
                                                    inj = local_4d0;
                                                  }
                                                  else {
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity =
                                                       0x5320636964726f4e;
                                                  aStack_4f8._8_3_ = 0x696b;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar3) {
                                                    s_00->type = nordicSki;
                                                    inj = local_4d0;
                                                  }
                                                  else {
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity._0_5_ =
                                                       0x65646952;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar3) {
                                                    s_00->type = ride;
                                                    inj = local_4d0;
                                                  }
                                                  else {
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity._0_4_ = 0x6e7552;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar3) {
                                                    s_00->type = run;
                                                    inj = local_4d0;
                                                  }
                                                  else {
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity._0_5_ =
                                                       0x6b6c6157;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  inj = local_4d0;
                                                  if (!bVar3) {
                                                    s_00->filterType = false;
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "\nWarning:  unknown type value ",0x1e)
                                                  ;
                                                  pbVar6 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  poVar8 = nlohmann::operator<<
                                                                     ((ostream *)&std::cout,pbVar6);
                                                  lVar10 = 0x24;
                                                  pcVar11 = ", defaulting to all activity types.\n";
                                                  goto LAB_0010aa35;
                                                  }
                                                  s_00->type = walk;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pkVar5 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                                  sVar1 = pkVar5->_M_string_length;
                                                  if (((sVar1 == local_2a8) &&
                                                      ((sVar1 == 0 ||
                                                       (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,
                                                                     local_2b0,sVar1), iVar4 == 0)))
                                                      ) && (pbVar6 = nlohmann::detail::
                                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar6->m_type == string))
                                                  {
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity =
                                                       0x6f69746176656c65;
                                                  aStack_4f8._8_2_ = 0x6e;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar3) {
                                                    s_00->mapType = elevation;
                                                    inj = local_4d0;
                                                  }
                                                  else {
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity =
                                                       0x746e656964617267;
                                                  aStack_4f8._8_8_ =
                                                       aStack_4f8._8_8_ & 0xffffffffffffff00;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  if (bVar3) {
                                                    s_00->mapType = gradient;
                                                    inj = local_4d0;
                                                  }
                                                  else {
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  aStack_4f8._M_allocated_capacity._0_5_ =
                                                       0x74616568;
                                                  _Var12._M_p = (pointer)&aStack_4f8;
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (&local_488,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&stack0xfffffffffffffaf8);
                                                  bVar3 = nlohmann::operator==(pbVar6,&local_488);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::~basic_json(&local_488);
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)_Var12._M_p != &aStack_4f8) {
                                                    operator_delete(_Var12._M_p,
                                                                    aStack_4f8._M_allocated_capacity
                                                                    + 1);
                                                  }
                                                  inj = local_4d0;
                                                  if (!bVar3) {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "\nWarning:  unknown map type value ",
                                                             0x22);
                                                  pbVar6 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  poVar8 = nlohmann::operator<<
                                                                     ((ostream *)&std::cout,pbVar6);
                                                  lVar10 = 0x1a;
                                                  pcVar11 = ", defaulting to heat map.\n";
                                                  goto LAB_0010aa35;
                                                  }
                                                  s_00->mapType = heat;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pkVar5 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                                  sVar1 = pkVar5->_M_string_length;
                                                  if ((sVar1 == local_450) &&
                                                     (((sVar1 == 0 ||
                                                       (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,
                                                                     local_458,sVar1), iVar4 == 0))
                                                      && (pbVar6 = nlohmann::detail::
                                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar6->m_type == string))
                                                  )) {
                                                    s_00->filterAfter = true;
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (local_b0,pbVar6);
                                                  str._M_string_length = (size_type)s_00;
                                                  str._M_dataplus._M_p =
                                                       (pointer)in_stack_fffffffffffffae8;
                                                  str.field_2._M_allocated_capacity._0_4_ = SVar16;
                                                  str.field_2._M_allocated_capacity._4_4_ = iVar17;
                                                  str.field_2._8_8_ = sVar18;
                                                  str2tm((tm *)&stack0xfffffffffffffaf8,str);
                                                  local_4b0->tm_zone = local_4d8;
                                                  local_4b0->tm_isdst = local_4e8;
                                                  *(undefined4 *)&local_4b0->field_0x24 = uStack_4e4
                                                  ;
                                                  local_4b0->tm_gmtoff = lStack_4e0;
                                                  local_4b0->tm_mon =
                                                       aStack_4f8._M_allocated_capacity._0_4_;
                                                  local_4b0->tm_year =
                                                       aStack_4f8._M_allocated_capacity._4_4_;
                                                  local_4b0->tm_wday = aStack_4f8._8_4_;
                                                  local_4b0->tm_yday = aStack_4f8._12_4_;
                                                  local_4b0->tm_sec = SVar16;
                                                  local_4b0->tm_min = iVar17;
                                                  local_4b0->tm_hour = (int)sVar18;
                                                  local_4b0->tm_mday = (int)(sVar18 >> 0x20);
                                                  if (local_b0[0] != local_a0) {
                                                    operator_delete(local_b0[0],local_a0[0] + 1);
                                                  }
                                                  tVar7 = mktime((tm *)local_4b0);
                                                  *local_110 = tVar7;
                                                  }
                                                  else {
                                                    pkVar5 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                                  sVar1 = pkVar5->_M_string_length;
                                                  if (((sVar1 == local_470) &&
                                                      ((sVar1 == 0 ||
                                                       (iVar4 = bcmp((pkVar5->_M_dataplus)._M_p,
                                                                     local_478,sVar1), iVar4 == 0)))
                                                      ) && (pbVar6 = nlohmann::detail::
                                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50), pbVar6->m_type == string))
                                                  {
                                                    s_00->filterBefore = true;
                                                    pbVar6 = nlohmann::detail::
                                                                                                                          
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  nlohmann::
                                                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ::
                                                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                            (local_d0,pbVar6);
                                                  str_00._M_string_length = (size_type)s_00;
                                                  str_00._M_dataplus._M_p =
                                                       (pointer)in_stack_fffffffffffffae8;
                                                  str_00.field_2._M_allocated_capacity._0_4_ =
                                                       SVar16;
                                                  str_00.field_2._M_allocated_capacity._4_4_ =
                                                       iVar17;
                                                  str_00.field_2._8_8_ = sVar18;
                                                  str2tm((tm *)&stack0xfffffffffffffaf8,str_00);
                                                  local_4b8->tm_zone = local_4d8;
                                                  local_4b8->tm_isdst = local_4e8;
                                                  *(undefined4 *)&local_4b8->field_0x24 = uStack_4e4
                                                  ;
                                                  local_4b8->tm_gmtoff = lStack_4e0;
                                                  local_4b8->tm_mon =
                                                       aStack_4f8._M_allocated_capacity._0_4_;
                                                  local_4b8->tm_year =
                                                       aStack_4f8._M_allocated_capacity._4_4_;
                                                  local_4b8->tm_wday = aStack_4f8._8_4_;
                                                  local_4b8->tm_yday = aStack_4f8._12_4_;
                                                  local_4b8->tm_sec = SVar16;
                                                  local_4b8->tm_min = iVar17;
                                                  local_4b8->tm_hour = (int)sVar18;
                                                  local_4b8->tm_mday = (int)(sVar18 >> 0x20);
                                                  if (local_d0[0] != local_c0) {
                                                    operator_delete(local_d0[0],local_c0[0] + 1);
                                                  }
                                                  tVar7 = mktime((tm *)local_4b8);
                                                  s_00->before = tVar7;
                                                  }
                                                  else {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             "\nWarning:  unknown JSON key \"",0x1d)
                                                  ;
                                                  pkVar5 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::key(&local_50);
                                                  poVar8 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             (pkVar5->_M_dataplus)._M_p,
                                                             pkVar5->_M_string_length);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar8,"\" with value \"",0xe);
                                                  pbVar6 = nlohmann::detail::
                                                                                                                      
                                                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                                  ::operator*(&local_50);
                                                  poVar8 = nlohmann::operator<<(poVar8,pbVar6);
                                                  lVar10 = 2;
                                                  pcVar11 = "\"\n";
LAB_0010aa35:
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar8,pcVar11,lVar10);
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                        goto LAB_0010b0f3;
                                      }
                                      pbVar6 = nlohmann::detail::
                                               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                               ::operator*(&local_50);
                                      nlohmann::
                                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                      ::
                                      get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                                ((tm *)&stack0xfffffffffffffaf8,pbVar6);
                                      this = (string *)&local_4a8;
                                    }
                                  }
                                }
                                std::__cxx11::string::operator=
                                          (this,(string *)&stack0xfffffffffffffaf8);
                                _Var12._M_p = (pointer)CONCAT44(iVar17,SVar16);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)_Var12._M_p != &aStack_4f8) goto LAB_0010a223;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0010b0f3:
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&local_50);
  }
  bVar3 = (bool)(~(byte)local_4c8 & 1);
  if ((local_4c4 & 1) == 0) {
    bVar3 = true;
  }
  if (((byte)local_4bc & (byte)local_4c0 & 1) == 0) {
    bVar3 = true;
  }
  s_00->fit = bVar3;
  if (s_00->mapType != heat) {
    s_00->sampling = linear;
    s_00->kernel = cylinder;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Image size",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,s_00->nx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,s_00->ny);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_378,local_370);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = \"",4);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(s_00->fname)._M_dataplus._M_p,(s_00->fname)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_398,local_390);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = \"",4);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(s_00->fgpx)._M_dataplus._M_p,(s_00->fgpx)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_250,local_248);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = \"",4);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(s_00->cmapFile)._M_dataplus._M_p,(s_00->cmapFile)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_3b8,local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = \"",4);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_4a8,local_4a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_3d8,local_3d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = \"",4);
  poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_3f8,local_3f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(s_00->c).imap);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_270,local_268);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_2d8,local_2d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,s_00->verb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_2f8,local_2f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  getSamplingName_abi_cxx11_((string *)&stack0xfffffffffffffaf8,s_00->sampling);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)CONCAT44(iVar17,SVar16),sVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(iVar17,SVar16) != &aStack_4f8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(iVar17,SVar16),aStack_4f8._M_allocated_capacity + 1);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_190,local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,s_00->r);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_290,local_288);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  poVar8 = std::ostream::_M_insert<double>(s_00->gka);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_418,local_410);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  getKernelName_abi_cxx11_((string *)&stack0xfffffffffffffaf8,s_00->kernel);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)CONCAT44(iVar17,SVar16),sVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(iVar17,SVar16) != &aStack_4f8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(iVar17,SVar16),aStack_4f8._M_allocated_capacity + 1);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_210,local_208);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  poVar8 = std::ostream::_M_insert<double>(s_00->margin);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_318,local_310);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_338,local_330);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_358,local_350);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_230,local_228);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_2b0,local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
  getMapTypeName_abi_cxx11_((string *)&stack0xfffffffffffffaf8,s_00->mapType);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)CONCAT44(iVar17,SVar16),sVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(iVar17,SVar16) != &aStack_4f8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(iVar17,SVar16),aStack_4f8._M_allocated_capacity + 1);
  }
  if (s_00->filterType == true) {
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_438,local_430);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    getTypeName_abi_cxx11_((string *)&stack0xfffffffffffffaf8,s_00->type);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)CONCAT44(iVar17,SVar16),sVar18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(iVar17,SVar16) != &aStack_4f8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(iVar17,SVar16),aStack_4f8._M_allocated_capacity + 1);
    }
  }
  if (s_00->filterAfter == true) {
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_458,local_450);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    __f._M_fmt = "%c";
    __f._M_tmb = local_4b0;
    pbVar9 = std::operator<<(poVar8,__f);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar9,"\n",1);
  }
  if (s_00->filterBefore == true) {
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_478,local_470);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    __f_00._M_fmt = "%c";
    __f_00._M_tmb = local_4b8;
    pbVar9 = std::operator<<(poVar8,__f_00);
    std::__ostream_insert<char,std::char_traits<char>>(pbVar9,"\n",1);
  }
  if (s_00->fit == false) {
    printBounds(s_00);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  iVar17 = std::__cxx11::string::compare((char *)local_2b8);
  if (iVar17 != 0) {
    iVar17 = std::__cxx11::string::compare((char *)&local_4a8);
    if (iVar17 == 0) {
      if ((s_00->allCmaps & 1U) != 0) goto LAB_0010bb9f;
    }
    else {
      if ((s_00->allCmaps & 1U) == 0) {
        paVar13 = &local_90.field_2;
        pcVar2 = (s_00->cmapFile)._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar2,pcVar2 + (s_00->cmapFile)._M_string_length);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_4a8,(long)local_4a8 + local_4a0);
        iVar17 = irwincolor::Map::load(&s_00->c,&local_90,&local_f0);
        _Var12._M_p = local_90._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          _Var12._M_p = local_90._M_dataplus._M_p;
        }
      }
      else {
LAB_0010bb9f:
        paVar13 = &local_70.field_2;
        pcVar2 = (s_00->cmapFile)._M_dataplus._M_p;
        local_70._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,pcVar2 + (s_00->cmapFile)._M_string_length);
        iVar17 = irwincolor::loadMapNames(&local_70,&s_00->mapNames);
        _Var12._M_p = local_70._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var12._M_p != paVar13) {
        operator_delete(_Var12._M_p,paVar13->_M_allocated_capacity + 1);
      }
      if (iVar17 != 0) goto LAB_0010bc05;
    }
  }
  iVar17 = 0;
LAB_0010bc05:
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0,local_2a0[0] + 1);
  }
  if (local_478 != local_468) {
    operator_delete(local_478,local_468[0] + 1);
  }
  if (local_458 != local_448) {
    operator_delete(local_458,local_448[0] + 1);
  }
  if (local_438 != local_428) {
    operator_delete(local_438,local_428[0] + 1);
  }
  if (local_418 != local_408) {
    operator_delete(local_418,local_408[0] + 1);
  }
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8,local_3e8[0] + 1);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8,local_3a8[0] + 1);
  }
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  if (local_398 != local_388) {
    operator_delete(local_398,local_388[0] + 1);
  }
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  if (local_358 != local_348) {
    operator_delete(local_358,local_348[0] + 1);
  }
  if (local_338 != local_328) {
    operator_delete(local_338,local_328[0] + 1);
  }
  if (local_318 != local_308) {
    operator_delete(local_318,local_308[0] + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  if (local_190 != local_180) {
    operator_delete(local_190,local_180[0] + 1);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8,local_2e8[0] + 1);
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
  }
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  if (local_4a8 != local_498) {
    operator_delete(local_4a8,local_498[0] + 1);
  }
  return iVar17;
}

Assistant:

int loadSettings(Settings& s, json& inj, std::string& fjson)
{
	// Initial defaults
	s.nx = 1280;
	s.ny = 720;
	s.verb = 0;
	s.sampling = autosample;
	s.r = 10;
	s.minx = 0.0;
	s.miny = 0.0;
	s.maxx = 0.0;
	s.maxy = 0.0;
	s.margin = 0.0;
	s.fitx = false;
	s.fity = false;
	s.fitnx = false;
	s.fitny = false;
	s.fname = fjson.substr(0, fjson.find_last_of("."));
	s.fgpx = "*.gpx";
	s.cmapFile = "";
	std::string cmapName = "";
	s.allCmaps = false;
	s.gka = 10.0;
	s.kernel = cone;
	s.filterType = false;
	s.filterAfter = false;
	s.after = 0;
	s.filterBefore = false;
	s.before = 0;
	s.mapType = heat;

	bool bminx = false, bminy = false, bmaxx = false, bmaxy = false;

	// JSON keys
	const std::string sizexId = "Image size x";
	const std::string sizeyId = "Image size y";
	const std::string verbId = "Verbosity";
	const std::string sampleId = "Sampling";
	const std::string radiusId = "Kernel radius";
	const std::string minxId = "Min x";
	const std::string minyId = "Min y";
	const std::string maxxId = "Max x";
	const std::string maxyId = "Max y";
	const std::string marginId = "Margin";
	const std::string fitxId = "Fit x";
	const std::string fityId = "Fit y";
	const std::string fitnxId = "Fit nx";
	const std::string fitnyId = "Fit ny";
	const std::string fnameId = "File name prefix";
	const std::string fgpxId = "GPX files";
	const std::string cmapFileId = "Colormap file";
	const std::string cmapNameId = "Colormap name";
	const std::string allCmapsId = "All colormaps";
	const std::string imapId = "Color map";
	const std::string invertMapId = "Invert color map";
	const std::string gaussianAmpId = "Gaussian amplitude";
	const std::string kernelId = "Kernel";
	const std::string typeId = "Type";
	const std::string afterId = "After";
	const std::string beforeId = "Before";
	const std::string mapTypeId = "Map type";

	for (json::iterator it = inj.begin(); it != inj.end(); it++)
	{
		//std::cout << "\nkey = " << it.key();
		if (it.key() == sizexId && it.value().is_number())
		{
			s.nx = it.value();
		}
		else if (it.key() == sizeyId && it.value().is_number())
		{
			s.ny = it.value();
		}
		else if (it.key() == verbId && it.value().is_number())
		{
			s.verb = it.value();
		}
		else if (it.key() == sampleId
				&& (it.value().is_number() || it.value().is_string()))
		{
			if (it.value().is_number())
				s.sampling = it.value();
			else
			{
				if (it.value() == getSamplingName(pointwise))
					s.sampling = pointwise;
				else if (it.value() == getSamplingName(linear))
					s.sampling = linear;
				else if (it.value() == getSamplingName(autosample))
					s.sampling = autosample;
				else
					std::cout << "\nWarning:  unknown sampling value "
							<< it.value() << ", defaulting to \""
							<< getSamplingName(autosample) << "\"\n";
			}
		}
		else if (it.key() == radiusId && it.value().is_number())
		{
			s.r = it.value();
		}
		else if (it.key() == minxId && it.value().is_number())
		{
			s.minx = it.value();
			bminx = true;
		}
		else if (it.key() == minyId && it.value().is_number())
		{
			s.miny = it.value();
			bminy = true;
		}
		else if (it.key() == maxxId && it.value().is_number())
		{
			s.maxx = it.value();
			bmaxx = true;
		}
		else if (it.key() == maxyId && it.value().is_number())
		{
			s.maxy = it.value();
			bmaxy = true;
		}
		else if (it.key() == marginId && it.value().is_number())
		{
			s.margin = it.value();
		}
		else if (it.key() == fitxId && it.value().is_boolean())
		{
			s.fitx = it.value();
		}
		else if (it.key() == fityId && it.value().is_boolean())
		{
			s.fity = it.value();
		}
		else if (it.key() == fitnxId && it.value().is_boolean())
		{
			s.fitnx = it.value();
		}
		else if (it.key() == fitnyId && it.value().is_boolean())
		{
			s.fitny = it.value();
		}
		else if (it.key() == fnameId && it.value().is_string())
		{
			s.fname = it.value();
		}
		else if (it.key() == fgpxId && it.value().is_string())
		{
			s.fgpx = it.value();
		}
		else if (it.key() == cmapFileId && it.value().is_string())
		{
			s.cmapFile = it.value();
		}
		else if (it.key() == cmapNameId && it.value().is_string())
		{
			cmapName = it.value();
		}
		else if (it.key() == imapId && it.value().is_number())
		{
			s.c.imap = it.value();
		}
		else if (it.key() == invertMapId && it.value().is_boolean())
		{
			s.c.inv = it.value();
		}
		else if (it.key() == allCmapsId && it.value().is_boolean())
		{
			s.allCmaps = it.value();
		}
		else if (it.key() == gaussianAmpId && it.value().is_number())
		{
			s.gka = it.value();
		}
		else if (it.key() == kernelId && it.value().is_string())
		{
			if (it.value() == getKernelName(pyramid))
				s.kernel = pyramid;
			else if (it.value() == getKernelName(cylinder))
				s.kernel = cylinder;
			else if (it.value() == getKernelName(gaussian))
				s.kernel = gaussian;
			else if (it.value() == getKernelName(cone))
				s.kernel = cone;
			else
				std::cout << "\nWarning:  unknown kernel value "
						<< it.value() << ", defaulting to \""
						<< getKernelName(cone) << "\"\n";
		}
		else if (it.key() == typeId && it.value().is_string())
		{
			s.filterType = true;
			if (it.value() == getTypeName(hike))
				s.type = hike;
			else if (it.value() == getTypeName(nordicSki))
				s.type = nordicSki;
			else if (it.value() == getTypeName(ride))
				s.type = ride;
			else if (it.value() == getTypeName(run))
				s.type = run;
			else if (it.value() == getTypeName(walk))
				s.type = walk;
			else
			{
				s.filterType = false;
				std::cout << "\nWarning:  unknown type value "
						<< it.value() << ", defaulting to all activity types.\n";
			}
		}
		else if (it.key() == mapTypeId && it.value().is_string())
		{
			if (it.value() == getMapTypeName(elevation))
				s.mapType = elevation;
			else if (it.value() == getMapTypeName(gradient))
				s.mapType = gradient;
			else if (it.value() == getMapTypeName(heat))
				s.mapType = heat;
			else
			{
				std::cout << "\nWarning:  unknown map type value "
						<< it.value() << ", defaulting to heat map.\n";
			}
		}
		else if (it.key() == afterId && it.value().is_string())
		{
			s.filterAfter = true;
			s.aftertm = str2tm((std::string) it.value());
			s.after = mktime(&s.aftertm);
		}
		else if (it.key() == beforeId && it.value().is_string())
		{
			s.filterBefore = true;
			s.beforetm = str2tm((std::string) it.value());
			s.before = mktime(&s.beforetm);
		}
		else
		{
			std::cout << "\nWarning:  unknown JSON key \"" << it.key()
					<< "\" with value \"" << it.value() << "\"\n";
		}
	}

	s.fit = !(bminx && bminy && bmaxx && bmaxy);

	if (s.mapType != heat)
	{
		// Linear sampling, cylinder kernel only for non-heat maps
		s.sampling = linear;
		s.kernel = cylinder;
	}

	// Echo inputs
	std::cout << "\n";
	std::cout << "Image size" << " = " << s.nx << ", " << s.ny << "\n";
	std::cout << fnameId << " = \"" << s.fname << "\"\n";
	std::cout << fgpxId << " = \"" << s.fgpx << "\"\n";
	std::cout << cmapFileId << " = \"" << s.cmapFile << "\"\n";
	std::cout << cmapNameId << " = \"" << cmapName << "\"\n";
	std::cout << allCmapsId << " = \"" << s.allCmaps << "\"\n";
	std::cout << imapId << " = " << s.c.imap << "\n";
	std::cout << invertMapId << " = " << s.c.inv << "\n";
	std::cout << verbId << " = " << s.verb << "\n";
	std::cout << sampleId << " = " << getSamplingName(s.sampling) << "\n";
	std::cout << radiusId << " = " << s.r << "\n";
	std::cout << gaussianAmpId << " = " << s.gka << "\n";
	std::cout << kernelId << " = " << getKernelName(s.kernel) << "\n";
	std::cout << marginId << " = " << s.margin << "\n";
	std::cout << fitxId << " = " << s.fitx << "\n";
	std::cout << fityId << " = " << s.fity << "\n";
	std::cout << fitnxId << " = " << s.fitnx << "\n";
	std::cout << fitnyId << " = " << s.fitny << "\n";
	std::cout << mapTypeId << " = " << getMapTypeName(s.mapType) << "\n";

	if (s.filterType) std::cout << typeId << " = " << getTypeName(s.type) << "\n";

	if (s.filterAfter) std::cout << afterId << " = " << std::put_time(&s.aftertm, "%c") << "\n";
	if (s.filterBefore) std::cout << beforeId << " = " << std::put_time(&s.beforetm, "%c") << "\n";

	//std::cout << "s.fit = " << s.fit << "\n";
	if (!s.fit)
		printBounds(s);

	std::cout << std::endl;

	if (s.cmapFile != "" && (cmapName != "" || s.allCmaps))
	{
		int io;
		if (s.allCmaps)
		{
			io = irwincolor::loadMapNames(s.cmapFile, s.mapNames);
			//std::cout << "mapNames = " << s.mapNames << std::endl;
		}
		else
			io = s.c.load(s.cmapFile, cmapName);
		if (io != 0) return io;
	}
	return 0;
}